

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O1

void old_keyfile_warning(void)

{
  termios cf;
  
  premsg(&cf);
  fputs("You are loading an SSH-2 private key which has an\nold version of the file format. This means your key\nfile is not fully tamperproof. Future versions of\nPuTTY may stop supporting this private key format,\nso we recommend you convert your key to the new\nformat.\n\nOnce the key is loaded into PuTTYgen, you can perform\nthis conversion simply by saving it again.\n"
        ,_stderr);
  if (stderr_is_a_tty == '\x01') {
    tcsetattr(2,1,(termios *)&cf);
  }
  return;
}

Assistant:

void old_keyfile_warning(void)
{
    static const char message[] =
        "You are loading an SSH-2 private key which has an\n"
        "old version of the file format. This means your key\n"
        "file is not fully tamperproof. Future versions of\n"
        "PuTTY may stop supporting this private key format,\n"
        "so we recommend you convert your key to the new\n"
        "format.\n"
        "\n"
        "Once the key is loaded into PuTTYgen, you can perform\n"
        "this conversion simply by saving it again.\n";

    struct termios cf;
    premsg(&cf);
    fputs(message, stderr);
    postmsg(&cf);
}